

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O3

EC_GROUP * EC_KEY_parse_parameters(CBS *cbs)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  EC_GROUP *pEVar5;
  BIGNUM *bn;
  EC_POINT *p;
  long lVar6;
  int line;
  EC_GROUP *pEVar7;
  CBS params;
  int has_cofactor;
  CBS curve_1;
  uint64_t version;
  CBS base;
  CBS field_id;
  CBS cofactor;
  CBS field_type;
  explicit_prime_curve curve;
  uint8_t local_129;
  BIGNUM *local_128;
  BIGNUM *local_120;
  BIGNUM *local_118;
  BIGNUM *local_110;
  BIGNUM *local_108;
  CBS local_100;
  int local_ec;
  CBS local_e8;
  uint64_t local_d8;
  CBS local_d0;
  CBS local_c0;
  CBS local_b0;
  CBS local_a0;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  iVar1 = CBS_peek_asn1_tag(cbs,0x20000010);
  if (iVar1 == 0) {
    pEVar5 = EC_KEY_parse_curve_name(cbs);
    return pEVar5;
  }
  iVar1 = CBS_get_asn1(cbs,&local_100,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBS_get_asn1_uint64(&local_100,&local_d8), iVar1 != 0)) &&
       (local_d8 == 1)) &&
      ((((iVar1 = CBS_get_asn1(&local_100,&local_c0,0x20000010), iVar1 != 0 &&
         (iVar1 = CBS_get_asn1(&local_c0,&local_a0,6), iVar1 != 0)) &&
        ((local_a0.len == 7 &&
         ((*(int *)((long)local_a0.data + 3) == 0x1013dce && *(int *)local_a0.data == -0x31b779d6 &&
          (iVar1 = CBS_get_asn1(&local_c0,&local_90,2), iVar1 != 0)))))) &&
       (iVar1 = CBS_is_unsigned_asn1_integer(&local_90), iVar1 != 0)))) &&
     ((local_c0.len == 0 && (iVar1 = CBS_get_asn1(&local_100,&local_e8,0x20000010), iVar1 != 0)))) {
    iVar1 = CBS_get_asn1(&local_e8,&local_80,4);
    if (iVar1 != 0) {
      iVar1 = CBS_get_asn1(&local_e8,&local_70,4);
      if ((((iVar1 != 0) &&
           (iVar1 = CBS_get_optional_asn1(&local_e8,(CBS *)0x0,(int *)0x0,3), iVar1 != 0)) &&
          (local_e8.len == 0)) && (iVar1 = CBS_get_asn1(&local_100,&local_d0,4), iVar1 != 0)) {
        iVar1 = CBS_get_asn1(&local_100,&local_40,2);
        if (((iVar1 != 0) && (iVar1 = CBS_is_unsigned_asn1_integer(&local_40), iVar1 != 0)) &&
           ((iVar1 = CBS_get_optional_asn1(&local_100,&local_b0,&local_ec,2), iVar1 != 0 &&
            (local_100.len == 0)))) {
          if ((local_ec != 0) && ((local_b0.len != 1 || (*local_b0.data != '\x01')))) {
            iVar1 = 0x7b;
            line = 0xfc;
            goto LAB_0017fb91;
          }
          iVar1 = CBS_get_u8(&local_d0,&local_129);
          if ((iVar1 == 0) || (local_129 != '\x04')) {
            iVar1 = 0x6f;
            line = 0x104;
            goto LAB_0017fb91;
          }
          if ((local_d0.len & 1) != 0) {
            iVar1 = 0x80;
            line = 0x109;
            goto LAB_0017fb91;
          }
          local_60.len = local_d0.len >> 1;
          local_60.data = local_d0.data;
          local_50.data = local_d0.data + local_60.len;
          local_50.len = local_60.len;
          local_120 = BN_new();
          pBVar2 = BN_new();
          pBVar3 = BN_new();
          pBVar4 = BN_new();
          local_128 = BN_new();
          local_118 = pBVar4;
          local_110 = pBVar3;
          local_108 = pBVar2;
          if ((pBVar4 == (BIGNUM *)0x0 || pBVar3 == (BIGNUM *)0x0) ||
              (pBVar2 == (BIGNUM *)0x0 || local_120 == (BIGNUM *)0x0)) {
            pEVar7 = (EC_GROUP *)0x0;
LAB_0017ff6f:
            if (local_128 != (BIGNUM *)0x0) {
              BN_free(local_128);
            }
            if (local_118 == (BIGNUM *)0x0) goto LAB_0017ff93;
          }
          else {
            if (local_128 != (BIGNUM *)0x0) {
              lVar6 = 0;
              do {
                pEVar5 = (EC_GROUP *)(**(code **)((long)kAllGroups + lVar6))();
                bn = EC_GROUP_get0_order(pEVar5);
                iVar1 = integers_equal(&local_40,bn);
                if (iVar1 != 0) {
                  iVar1 = EC_GROUP_get_curve_GFp
                                    ((EC_GROUP *)pEVar5,local_120,local_108,local_110,(BN_CTX *)0x0)
                  ;
                  pEVar7 = (EC_GROUP *)0x0;
                  if (iVar1 == 0) goto LAB_0017ff6f;
                  iVar1 = integers_equal(&local_90,(BIGNUM *)local_120);
                  if (((iVar1 != 0) &&
                      (iVar1 = integers_equal(&local_80,(BIGNUM *)local_108), iVar1 != 0)) &&
                     (iVar1 = integers_equal(&local_70,(BIGNUM *)local_110), iVar1 != 0)) {
                    p = EC_GROUP_get0_generator((EC_GROUP *)pEVar5);
                    iVar1 = EC_POINT_get_affine_coordinates_GFp
                                      ((EC_GROUP *)pEVar5,p,local_118,local_128,(BN_CTX *)0x0);
                    pEVar7 = (EC_GROUP *)0x0;
                    if ((iVar1 == 0) ||
                       ((iVar1 = integers_equal(&local_60,(BIGNUM *)local_118), iVar1 != 0 &&
                        (iVar1 = integers_equal(&local_50,(BIGNUM *)local_128), pEVar7 = pEVar5,
                        iVar1 != 0)))) goto LAB_0017ff6f;
                  }
                  break;
                }
                lVar6 = lVar6 + 8;
              } while (lVar6 != 0x20);
              ERR_put_error(0xf,0,0x7b,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                            ,0x179);
              pEVar7 = (EC_GROUP *)0x0;
              goto LAB_0017ff6f;
            }
            pEVar7 = (EC_GROUP *)0x0;
          }
          BN_free(local_118);
LAB_0017ff93:
          if (local_110 != (BIGNUM *)0x0) {
            BN_free(local_110);
          }
          if (local_108 != (BIGNUM *)0x0) {
            BN_free(local_108);
          }
          if (local_120 == (BIGNUM *)0x0) {
            return pEVar7;
          }
          BN_free(local_120);
          return pEVar7;
        }
      }
    }
  }
  iVar1 = 0x80;
  line = 0xf4;
LAB_0017fb91:
  ERR_put_error(0xf,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,line);
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_KEY_parse_parameters(CBS *cbs) {
  if (!CBS_peek_asn1_tag(cbs, CBS_ASN1_SEQUENCE)) {
    return EC_KEY_parse_curve_name(cbs);
  }

  // OpenSSL sometimes produces ECPrivateKeys with explicitly-encoded versions
  // of named curves.
  //
  // TODO(davidben): Remove support for this.
  struct explicit_prime_curve curve;
  if (!parse_explicit_prime_curve(cbs, &curve)) {
    return nullptr;
  }

  bssl::UniquePtr<BIGNUM> p(BN_new());
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> x(BN_new());
  bssl::UniquePtr<BIGNUM> y(BN_new());
  if (p == nullptr || a == nullptr || b == nullptr || x == nullptr ||
      y == nullptr) {
    return nullptr;
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (!integers_equal(&curve.order, EC_GROUP_get0_order(group))) {
      continue;
    }

    // The order alone uniquely identifies the group, but we check the other
    // parameters to avoid misinterpreting the group.
    if (!EC_GROUP_get_curve_GFp(group, p.get(), a.get(), b.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.prime, p.get()) ||
        !integers_equal(&curve.a, a.get()) ||
        !integers_equal(&curve.b, b.get())) {
      break;
    }
    if (!EC_POINT_get_affine_coordinates_GFp(
            group, EC_GROUP_get0_generator(group), x.get(), y.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.base_x, x.get()) ||
        !integers_equal(&curve.base_y, y.get())) {
      break;
    }
    return const_cast<EC_GROUP *>(group);
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return nullptr;
}